

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O1

uint8_t * __thiscall
cdnsBlockTables::parse_map_item
          (cdnsBlockTables *this,uint8_t *old_in,uint8_t *in_max,int64_t val,int *err)

{
  uint8_t *puVar1;
  char *pcVar2;
  vector<cbor_bytes,_std::allocator<cbor_bytes>_> *v;
  int dump_err;
  char *p_out;
  char out_buf [1024];
  int local_444;
  char *local_440;
  char local_438 [1024];
  char local_38 [8];
  
  switch(val) {
  case 0:
    v = &this->addresses;
    goto LAB_00179463;
  case 1:
    puVar1 = cbor_array_parse<cdns_class_id>(old_in,in_max,&this->class_ids,err);
    break;
  case 2:
    v = &this->name_rdata;
LAB_00179463:
    puVar1 = cbor_array_parse<cbor_bytes>(old_in,in_max,v,err);
    break;
  case 3:
    puVar1 = cbor_ctx_array_parse<cdns_query_signature,cdnsBlock>
                       (old_in,in_max,&this->q_sigs,err,this->current_block);
    break;
  case 4:
    puVar1 = cbor_array_parse<cdns_question_list>(old_in,in_max,&this->question_list,err);
    break;
  case 5:
    puVar1 = cbor_array_parse<cdns_question>(old_in,in_max,&this->qrr,err);
    break;
  case 6:
    puVar1 = cbor_array_parse<cdns_rr_list>(old_in,in_max,&this->rr_list,err);
    break;
  case 7:
    puVar1 = cbor_array_parse<cdns_rr_field>(old_in,in_max,&this->rrs,err);
    break;
  default:
    puVar1 = cbor_skip(old_in,in_max,err);
  }
  if (puVar1 == (uint8_t *)0x0) {
    local_440 = local_438;
    local_444 = 0;
    if ((ulong)val < 8) {
      pcVar2 = (&PTR_anon_var_dwarf_76fab_001acd60)[val];
    }
    else {
      pcVar2 = "unknown";
    }
    fprintf(_stderr,"Cannot parse block table item %d (%s), err: %d\n",val & 0xffffffff,pcVar2,
            (ulong)(uint)*err);
    if ((ulong)val < 8) {
      pcVar2 = (&PTR_anon_var_dwarf_76fab_001acd60)[val];
    }
    else {
      pcVar2 = "unknown item";
    }
    fprintf(_stderr,"Error %d parsing %s:\n",(ulong)(uint)*err,pcVar2);
    cbor_to_text(old_in,in_max,&local_440,local_38,&local_444);
    fprintf(_stderr,"%s\n",local_438);
  }
  return puVar1;
}

Assistant:

uint8_t* cdnsBlockTables::parse_map_item(uint8_t* old_in, uint8_t const* in_max, int64_t val, int* err)
{
    uint8_t * in = old_in;

    switch (val) {
    case 0: // ip_address
        in = cbor_array_parse(in, in_max, &addresses, err);
        break;
    case 1: // classtype
        in = cbor_array_parse(in, in_max, &class_ids, err);
        break;
    case 2: // name_rdata
        in = cbor_array_parse(in, in_max, &name_rdata, err);
        break;
    case 3: // query_signature
        in = cbor_ctx_array_parse(in, in_max, &q_sigs, err, current_block);
        break;
    case 4: // question_list,
        in = cbor_array_parse(in, in_max, &question_list, err);
        break;
    case 5: // question_rr,
        in = cbor_array_parse(in, in_max, &qrr, err);
        break;
    case 6: // rr_list,
        in = cbor_array_parse(in, in_max, &rr_list, err);
        break;
    case 7: // rr,
        in = cbor_array_parse(in, in_max, &rrs, err);
        break;
    default:
        in = cbor_skip(in, in_max, err);
    }

    if (in == NULL) {
        char out_buf[1024];
        char* p_out = out_buf;
        int dump_err = 0;
        char const* e[] = { "ip_address", "classtype", "name_rdata", "query_signature", "question_list", "question_rr", "rr_list", "rr" };
        int nb_e = (int)sizeof(e) / sizeof(char const*);

        fprintf(stderr, "Cannot parse block table item %d (%s), err: %d\n", (int)val,
            (val >= 0 && val < nb_e) ? e[val] : "unknown", *err);

        fprintf(stderr, "Error %d parsing %s:\n", *err, (val >= 0 && val < nb_e) ? e[val] : "unknown item");
        (void)cbor_to_text(old_in, in_max, &p_out, out_buf + sizeof(out_buf), &dump_err);
        fprintf(stderr, "%s\n", out_buf);
    }

    return in;
}